

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtimer.cpp
# Opt level: O2

void QTimer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  TimerType *pTVar1;
  bool bVar2;
  TimerType TVar3;
  QBindableInterface *pQVar4;
  long *plVar5;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      timeout();
      return;
    case 1:
      start((QTimer *)_o,*_a[1]);
      return;
    case 2:
      start((QTimer *)_o);
      return;
    case 3:
      stop((QTimer *)_o);
      return;
    }
    break;
  case ReadProperty:
    if (4 < (uint)_id) {
      return;
    }
    pTVar1 = (TimerType *)*_a;
    switch(_id) {
    case 0:
      bVar2 = isSingleShot((QTimer *)_o);
      goto LAB_0029fbc0;
    case 1:
      TVar3 = interval((QTimer *)_o);
      break;
    case 2:
      TVar3 = remainingTime((QTimer *)_o);
      break;
    case 3:
      TVar3 = timerType((QTimer *)_o);
      break;
    case 4:
      bVar2 = isActive((QTimer *)_o);
LAB_0029fbc0:
      *(bool *)pTVar1 = bVar2;
      return;
    }
    *pTVar1 = TVar3;
    break;
  case WriteProperty:
    pTVar1 = (TimerType *)*_a;
    if (_id == 3) {
      setTimerType((QTimer *)_o,*pTVar1);
      return;
    }
    if (_id == 1) {
      setInterval((QTimer *)_o,*pTVar1);
      return;
    }
    if (_id == 0) {
      setSingleShot((QTimer *)_o,SUB41(*pTVar1,0));
      return;
    }
    break;
  case IndexOfMethod:
    QtMocHelpers::indexOfMethod<void(QTimer::*)(QTimer::QPrivateSignal)>
              ((QtMocHelpers *)_a,(void **)timeout,0,0);
    return;
  case BindableProperty:
    switch(_id) {
    case 0:
      plVar5 = (long *)*_a;
      *plVar5 = (long)&(_o->d_ptr).d[1].metaObject;
      pQVar4 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectBindableProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_single_offset,_nullptr>,_void>
                ::iface;
      break;
    case 1:
      plVar5 = (long *)*_a;
      *plVar5 = (long)((long)&(_o->d_ptr).d[1].children.d.size + 4);
      pQVar4 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>,_void>
                ::iface;
      break;
    default:
      goto switchD_0029fa8c_caseD_3;
    case 3:
      plVar5 = (long *)*_a;
      *plVar5 = (long)((long)&(_o->d_ptr).d[1].metaObject + 4);
      pQVar4 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectBindableProperty<QTimerPrivate,_Qt::TimerType,_&QTimerPrivate::_qt_property_type_offset,_nullptr>,_void>
                ::iface;
      break;
    case 4:
      plVar5 = (long *)*_a;
      *plVar5 = (long)&(_o->d_ptr).d[1].bindingStorage;
      pQVar4 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectComputedProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_isActiveData_offset,_&QTimerPrivate::isActive>,_void>
                ::iface;
    }
    plVar5[1] = (long)pQVar4;
  }
switchD_0029fa8c_caseD_3:
  return;
}

Assistant:

void QTimer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTimer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->timeout(QPrivateSignal()); break;
        case 1: _t->start((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->start(); break;
        case 3: _t->stop(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTimer::*)(QPrivateSignal)>(_a, &QTimer::timeout, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isSingleShot(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->interval(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->remainingTime(); break;
        case 3: *reinterpret_cast<Qt::TimerType*>(_v) = _t->timerType(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->isActive(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSingleShot(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setInterval(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setTimerType(*reinterpret_cast<Qt::TimerType*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableSingleShot(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableInterval(); break;
        case 3: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableTimerType(); break;
        case 4: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableActive(); break;
        default: break;
        }
    }
}